

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_errstr(int rc)

{
  char *pcVar1;
  int rc_local;
  
  pcVar1 = sqlite3ErrStr(rc);
  return pcVar1;
}

Assistant:

SQLITE_API const char *sqlite3_errstr(int rc){
  return sqlite3ErrStr(rc);
}